

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

void __thiscall TestClass2::~TestClass2(TestClass2 *this)

{
  TestClass2 *this_local;
  
  if (this->m_DoublePtr != (double *)0x0) {
    operator_delete(this->m_DoublePtr,8);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TestClass2() {
        delete m_DoublePtr;
    }